

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_node.cpp
# Opt level: O1

void __thiscall
DoubleNode::Act(DoubleNode *this,stack<double,_std::deque<double,_std::allocator<double>_>_> *s)

{
  _Elt_pointer pdVar1;
  
  pdVar1 = (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (pdVar1 != (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    *pdVar1 = this->value_;
    (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = pdVar1 + 1;
    return;
  }
  std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
            ((deque<double,std::allocator<double>> *)s,&this->value_);
  return;
}

Assistant:

void DoubleNode::Act(std::stack<double> &s) const {
  s.push(value_);
}